

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functors.h
# Opt level: O0

float __thiscall
cnn::FBinaryLogLossBackward::operator()(FBinaryLogLossBackward *this,float x,float x_true)

{
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  undefined4 local_14;
  undefined4 local_4;
  
  if ((in_XMM0_Da != in_XMM1_Da) || (NAN(in_XMM0_Da) || NAN(in_XMM1_Da))) {
    local_14 = in_XMM0_Da;
    if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
      local_14 = std::numeric_limits<float>::min();
    }
    if ((local_14 == 1.0) && (!NAN(local_14))) {
      local_14 = 0.9999999;
    }
    if ((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) {
      if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
        local_4 = *in_RDI * ((1.0 - in_XMM1_Da) / (1.0 - local_14) + -in_XMM1_Da / local_14);
      }
      else {
        local_4 = (*in_RDI * (1.0 - in_XMM1_Da)) / (1.0 - local_14);
      }
    }
    else {
      local_4 = (*in_RDI * -in_XMM1_Da) / local_14;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

CNN_DEVICE_FUNC inline float operator()(float x, float x_true) const {
    if (x == x_true) return 0;
    if (x == 0.f) x = CNN_DEVICE_MIN;
    if (x == 1.f) x = 0.9999999f;
    if (x_true == 1.f) {
      return d * -x_true / x;
    } else if (x_true == 0.f) {
      return d * (1.f - x_true) / (1.f - x);
    }
    return d * ((1.f - x_true) / (1.f - x) + (-x_true / x));
  }